

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

double __thiscall ON_OBSOLETE_V5_DimRadial::NumericValue(ON_OBSOLETE_V5_DimRadial *this)

{
  int iVar1;
  ON_2dPoint *this_00;
  ON_2dPoint *p;
  ON_2dVector local_28;
  double local_18;
  double d;
  ON_OBSOLETE_V5_DimRadial *this_local;
  
  local_18 = 0.0;
  d = (double)this;
  iVar1 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if (3 < iVar1) {
    this_00 = ON_SimpleArray<ON_2dPoint>::operator[]
                        (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                          super_ON_SimpleArray<ON_2dPoint>,0);
    p = ON_SimpleArray<ON_2dPoint>::operator[]
                  (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                    super_ON_SimpleArray<ON_2dPoint>,1);
    local_28 = ON_2dPoint::operator-(this_00,p);
    local_18 = ON_2dVector::Length(&local_28);
    if ((this->super_ON_OBSOLETE_V5_Annotation).m_type == dtDimDiameter) {
      local_18 = local_18 * 2.0;
    }
  }
  return local_18;
}

Assistant:

double ON_OBSOLETE_V5_DimRadial::NumericValue() const
{
  double d = 0.0;
  if ( m_points.Count() >= dim_pt_count )
  {
    d = (m_points[center_pt_index] - m_points[arrow_pt_index]).Length();
    if( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter == m_type )
      d *= 2.0;
  }
  return d;
}